

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char>_>
fmt::v8::detail::write<char,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char>_> out,char *value)

{
  basic_string_view<char> value_00;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar1;
  char *in_RSI;
  size_t in_RDI;
  char *in_stack_ffffffffffffffc0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_ffffffffffffffe8;
  
  if (in_RSI == (char *)0x0) {
    throw_format_error(in_stack_ffffffffffffffc0);
  }
  std::char_traits<char>::length((char_type *)0x190c2c);
  value_00.size_ = in_RDI;
  value_00.data_ = in_RSI;
  bVar1 = write<char,std::back_insert_iterator<fmt::v8::detail::buffer<char>>>
                    (in_stack_ffffffffffffffe8,value_00);
  return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}